

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O1

int assetsys_file_size(assetsys_t *sys,assetsys_file_t file)

{
  char *__dest;
  assetsys_internal_mount_t *paVar1;
  uint uVar2;
  int iVar3;
  strpool_internal_entry_t *psVar4;
  char *__src;
  unsigned_long_long *puVar5;
  long lVar6;
  stat sStack_b8;
  
  uVar2 = 0xffffffff;
  if (0 < (long)sys->mounts_count) {
    puVar5 = &sys->mounts->mounted_as;
    lVar6 = 0;
    do {
      if ((*puVar5 == file.mount) &&
         (((assetsys_internal_mount_t *)(puVar5 + -1))->path == file.path)) {
        uVar2 = (uint)lVar6;
        break;
      }
      lVar6 = lVar6 + 1;
      puVar5 = puVar5 + 0x13;
    } while (sys->mounts_count != lVar6);
  }
  if ((int)uVar2 < 0) {
    iVar3 = 0;
  }
  else {
    paVar1 = sys->mounts + uVar2;
    if (sys->mounts[uVar2].type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR) {
      __dest = sys->temp;
      psVar4 = strpool_internal_get_entry(&sys->strpool,paVar1->path);
      strcpy(__dest,psVar4->data + 8);
      __src = "/";
      if (sys->temp[0] == '\0') {
        __src = "";
      }
      strcat(__dest,__src);
      psVar4 = strpool_internal_get_entry
                         (&sys->strpool,sys->collated[paVar1->files[file.index].collated_index].path
                         );
      strcat(__dest,psVar4->data + (long)paVar1->mount_len + 9);
      iVar3 = stat(__dest,&sStack_b8);
      if (iVar3 == 0) {
        paVar1->files[file.index].size = (int)sStack_b8.st_size;
      }
    }
    iVar3 = paVar1->files[file.index].size;
  }
  return iVar3;
}

Assistant:

int assetsys_file_size( assetsys_t* sys, assetsys_file_t file )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, file.mount, file.path );
    if( mount_index < 0 ) return 0;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ mount->files[ file.index ].collated_index ].path ) + mount->mount_len + 1 );
        struct stat s;
        if( stat( sys->temp, &s ) == 0 )
            mount->files[ file.index ].size = (int) s.st_size;
        }
        
    return mount->files[ file.index ].size;
    }